

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.h
# Opt level: O3

StringValueEventLogEntry * __thiscall
TTD::EventLog::
ReplayGetReplayEvent_Helper<TTD::NSLogEvents::StringValueEventLogEntry,(TTD::NSLogEvents::EventKind)6>
          (EventLog *this)

{
  TTEventListLink *pTVar1;
  ulong uVar2;
  EventLogEntry *pEVar3;
  
  pTVar1 = (this->m_currentReplayEventIterator).m_currLink;
  if (((pTVar1 == (TTEventListLink *)0x0) ||
      (uVar2 = (this->m_currentReplayEventIterator).m_currIdx, uVar2 < pTVar1->StartPos)) ||
     (pTVar1->CurrPos <= uVar2)) {
    AbortReplayReturnToHost(this);
  }
  pEVar3 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  if (pEVar3->EventTimeStamp != this->m_eventTimeCtr) {
    TTDAbort_unrecoverable_error("Out of Sync!!!");
  }
  pEVar3 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  AdvanceTimeAndPositionForReplay(this);
  if (pEVar3->EventKind == StringTag) {
    return (StringValueEventLogEntry *)(pEVar3 + 1);
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

const T* ReplayGetReplayEvent_Helper()
        {
            if(!this->m_currentReplayEventIterator.IsValid())
            {
                this->AbortReplayReturnToHost();
            }

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            TTDAssert(this->m_currentReplayEventIterator.Current()->EventTimeStamp == this->m_eventTimeCtr, "Out of Sync!!!");
#endif

            const NSLogEvents::EventLogEntry* evt = this->m_currentReplayEventIterator.Current();

            this->AdvanceTimeAndPositionForReplay();

            return NSLogEvents::GetInlineEventDataAs<T, tag>(evt);
        }